

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void ShowAllRooms(void)

{
  Room *this;
  ostream *poVar1;
  char *pcVar2;
  int local_14;
  int i;
  Room *user;
  
  for (local_14 = 0; local_14 < Admin::Innopolis->rooms_len; local_14 = local_14 + 1) {
    this = Admin::Innopolis->rooms + local_14;
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->room_id);
    poVar1 = std::operator<<(poVar1," ");
    pcVar2 = Room::getName(this);
    poVar1 = std::operator<<(poVar1,pcVar2);
    poVar1 = std::operator<<(poVar1," ");
    pcVar2 = Room::getAccessLevel(this);
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void ShowAllRooms(){
    Room* user;
    for(int i=0;i<Admin::Innopolis->rooms_len;i++){
        user =&(Admin::Innopolis->rooms[i]);
        cout<<user->room_id<<" "<<user->getName()<<" "<<user->getAccessLevel()<<endl;
    }
}